

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLBK.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix::verifyLBK(int LBK)

{
  undefined8 *puVar1;
  
  if (LBK == 2) {
    return;
  }
  tools::Log::error<char_const*>("Encountered the wrong LBK value");
  tools::Log::info<char_const*>("Expected LBK to be equal to 2");
  tools::Log::info<char_const*,int>("LBK value: {}",LBK);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLBK( int LBK ) {

  if ( LBK != 2 ) {

    Log::error( "Encountered the wrong LBK value" );
    Log::info( "Expected LBK to be equal to 2" );
    Log::info( "LBK value: {}", LBK );
    throw std::exception();
  }
}